

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planck_unit.c
# Opt level: O0

planck_unit_result_t
planck_unit_assert_int_are_not_equal
          (planck_unit_test_t *state,int32_t expected,int32_t actual,int line,char *file)

{
  planck_unit_result_t pVar1;
  int iVar2;
  char *__s;
  char *buffer;
  int message_size;
  char *message;
  char *file_local;
  uint local_18;
  int line_local;
  int32_t actual_local;
  int32_t expected_local;
  planck_unit_test_t *state_local;
  
  local_18 = actual;
  line_local = expected;
  _actual_local = state;
  iVar2 = planck_unit_check_int_space("expected not int %ld, got %ld",&line_local,&local_18);
  _actual_local->allocated_message = '\x01';
  __s = (char *)malloc((long)iVar2);
  if ((__s != (char *)0x0) && (iVar2 != 0)) {
    sprintf(__s,"expected not int %ld, got %ld",(ulong)(uint)line_local,(ulong)local_18);
    pVar1 = planck_unit_assert_true(_actual_local,(uint)(line_local != local_18),line,file,__s);
    return pVar1;
  }
  free(__s);
  printf("out of memory");
  fflush(_stdout);
  exit(-1);
}

Assistant:

planck_unit_result_t
planck_unit_assert_int_are_not_equal(
	planck_unit_test_t	*state,
	int32_t					expected,
	int32_t					actual,
	int					line,
	const char			*file
) {
	const char	*message;
	int			message_size;
	char		*buffer;

	message						= "expected not int %ld, got %ld";

	message_size				= planck_unit_check_int_space(message, &expected, &actual);
	state->allocated_message	= 1;
	buffer						= malloc(message_size);

	if ((NULL == buffer) || !message_size) {
		free(buffer);
		PLANCK_UNIT_PRINT_STR("out of memory");
		exit(-1);
	}

	sprintf(buffer, message, expected, actual);

	return planck_unit_assert_true(state, expected != actual, line, file, buffer);
}